

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::add
          (RequiredExtensions *this,char *ext)

{
  deBool dVar1;
  size_type sVar2;
  reference ppcVar3;
  int local_1c;
  char *pcStack_18;
  int ndx;
  char *ext_local;
  RequiredExtensions *this_local;
  
  local_1c = 0;
  pcStack_18 = ext;
  ext_local = (char *)this;
  while( true ) {
    sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->m_extensions);
    if ((int)sVar2 <= local_1c) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&this->m_extensions,&stack0xffffffffffffffe8);
      return;
    }
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->m_extensions,(long)local_1c);
    dVar1 = deStringEqual(*ppcVar3,pcStack_18);
    if (dVar1 == 1) break;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void RequiredExtensions::add (const char* ext)
{
	for (int ndx = 0; ndx < (int)m_extensions.size(); ++ndx)
		if (deStringEqual(m_extensions[ndx], ext) == DE_TRUE)
			return;
	m_extensions.push_back(ext);
}